

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.h
# Opt level: O1

uint64_t __thiscall Histogram::estimate(Histogram *this,double percentile)

{
  __int_type _Var1;
  __int_type _Var2;
  uint64_t uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  undefined4 uVar13;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  uVar3 = 0;
  if ((0.0 < percentile) && (percentile < 100.0)) {
    _Var1 = (this->count).super___atomic_base<unsigned_long>._M_i;
    auVar17._8_4_ = (int)(_Var1 >> 0x20);
    auVar17._0_8_ = _Var1;
    auVar17._12_4_ = 0x45300000;
    dVar10 = (((auVar17._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)_Var1) - 4503599627370496.0)) * (100.0 - percentile)
             ) / 100.0;
    uVar4 = (ulong)dVar10;
    uVar8 = (long)(dVar10 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
    if (uVar8 == 0) {
      uVar3 = (this->max).super___atomic_base<unsigned_long>._M_i;
    }
    else {
      uVar9 = 0;
      lVar6 = 0;
      uVar7 = 0;
      do {
        _Var1 = this->bins[lVar6].super___atomic_base<unsigned_long>._M_i;
        uVar7 = uVar7 + _Var1;
        lVar5 = uVar7 - uVar8;
        if (uVar8 <= uVar7) {
          uVar4 = -(ulong)(lVar6 == 0) | 1L << (uVar9 & 0x3f);
          dVar10 = this->EXP_BASE;
          uVar13 = (undefined4)(uVar4 >> 0x20);
          if ((this->max).super___atomic_base<unsigned_long>._M_i < uVar4) {
            _Var2 = (this->max).super___atomic_base<unsigned_long>._M_i;
            auVar11._8_4_ = (int)(_Var2 >> 0x20);
            auVar11._0_8_ = _Var2;
            auVar11._12_4_ = 0x45300000;
            auVar12._8_4_ = uVar13;
            auVar12._0_8_ = uVar4;
            auVar12._12_4_ = 0x45300000;
            dVar10 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)_Var2) - 4503599627370496.0)) /
                     (((auVar12._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) * 0.5);
          }
          auVar14._8_4_ = (int)((ulong)lVar5 >> 0x20);
          auVar14._0_8_ = lVar5;
          auVar14._12_4_ = 0x45300000;
          auVar15._8_4_ = (int)(_Var1 >> 0x20);
          auVar15._0_8_ = _Var1;
          auVar15._12_4_ = 0x45300000;
          dVar10 = pow(dVar10,((auVar14._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) /
                              ((auVar15._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)_Var1) - 4503599627370496.0)));
          auVar16._0_8_ = (double)CONCAT44(0x43300000,(int)uVar4);
          auVar16._8_4_ = uVar13;
          auVar16._12_4_ = 0x45300000;
          dVar10 = ((auVar16._8_8_ - 1.9342813113834067e+25) + (auVar16._0_8_ - 4503599627370496.0))
                   * dVar10 * 0.5;
          uVar4 = (ulong)dVar10;
          uVar4 = (long)(dVar10 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
        }
        if (uVar8 <= uVar7) {
          return uVar4;
        }
        lVar6 = lVar6 + 1;
        uVar9 = uVar9 - 1;
      } while (lVar6 != 0x41);
      uVar3 = 0;
    }
  }
  return uVar3;
}

Assistant:

uint64_t estimate(double percentile) {
        if (percentile <= 0 || percentile >= 100) {
            return 0;
        }

        double rev = 100 - percentile;
        size_t i;
        uint64_t sum = 0;
        uint64_t total = getTotal();
        uint64_t threshold = (uint64_t)( (double)total * rev / 100.0 );

        if (!threshold) {
            // No samples between the given percentile and the max number.
            // Return max number.
            return max;
        }

        for (i=0; i<MAX_BINS; ++i) {
            uint64_t n_entries = bins[i].load(std::memory_order_relaxed);
            sum += n_entries;
            if (sum < threshold) continue;

            uint64_t gap = sum - threshold;
            uint64_t u_bound = HistItr(i, MAX_BINS, this).getUpperBound();
            double base = EXP_BASE;
            if (max < u_bound) {
                base = (double)max / (u_bound / 2.0);
            }

            return (uint64_t)
                   ( std::pow(base, (double)gap / n_entries) * u_bound / 2 );
        }
        return 0;
    }